

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O3

void __thiscall OpenMD::NPTf::calcVelScale(NPTf *this)

{
  double dVar1;
  int i;
  long lVar2;
  int j;
  long lVar3;
  Mat3x3d *pMVar4;
  double dVar5;
  
  dVar1 = (this->super_NPT).thermostat.first;
  pMVar4 = &this->vScale;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      dVar5 = pMVar4[-3].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
              [lVar3];
      if (lVar2 == lVar3) {
        dVar5 = dVar5 + dVar1;
      }
      (pMVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar3] =
           dVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    pMVar4 = (Mat3x3d *)
             ((pMVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar2 != 3);
  return;
}

Assistant:

void NPTf::calcVelScale() {
    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        vScale(i, j) = eta(i, j);

        if (i == j) { vScale(i, j) += thermostat.first; }
      }
    }
  }